

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void al_uninstall_system(void)

{
  _AL_DTOR_LIST *in_stack_00000010;
  
  _al_run_destructors(in_stack_00000010);
  _al_run_exit_funcs();
  _al_shutdown_destructors((_AL_DTOR_LIST *)0x17eb84);
  _al_dtor_list = (_AL_DTOR_LIST *)0x0;
  _al_glsl_shutdown_shaders();
  _al_shutdown_logging();
  return;
}

Assistant:

void al_uninstall_system(void)
{
   /* Note: al_uninstall_system may get called multiple times without an
    * al_install_system in between. For example if the user manually
    * calls it at the end of the program it is called right again
    * because it's installed as an atexit function by al_init.
    */

   _al_run_destructors(_al_dtor_list);
   _al_run_exit_funcs();
   _al_shutdown_destructors(_al_dtor_list);
   _al_dtor_list = NULL;

#ifdef ALLEGRO_CFG_SHADER_GLSL
   _al_glsl_shutdown_shaders();
#endif

   _al_shutdown_logging();

   /* shutdown_system_driver is registered as an exit func so we don't need
    * to do any more here.
    */

   ASSERT(active_sysdrv == NULL);
}